

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler.cpp
# Opt level: O0

int __thiscall
LockstepScheduler::cond_timedwait
          (LockstepScheduler *this,pthread_cond_t *cond,pthread_mutex_t *lock,uint64_t time_us)

{
  vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  *pvVar1;
  pthread_mutex_t *ppVar2;
  pthread_cond_t *ppVar3;
  vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  *pvVar4;
  int *piVar5;
  element_type *peVar6;
  vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  *in_RCX;
  pthread_mutex_t *in_RDX;
  pthread_cond_t *in_RSI;
  long in_RDI;
  lock_guard<std::mutex> lock_timed_waits_1;
  int result;
  lock_guard<std::mutex> lock_timed_waits;
  shared_ptr<LockstepScheduler::TimedWait> new_timed_wait;
  mutex_type *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar7;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff58;
  value_type *__x;
  int local_64;
  value_type local_60;
  uint local_50;
  vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  *local_28;
  pthread_mutex_t *local_20;
  pthread_cond_t *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::shared_ptr<LockstepScheduler::TimedWait>::shared_ptr
            ((shared_ptr<LockstepScheduler::TimedWait> *)0x116421);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
             ,in_stack_ffffffffffffff48);
  pvVar1 = local_28;
  pvVar4 = (vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
            *)std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff58);
  if (pvVar4 < pvVar1) {
    std::make_shared<LockstepScheduler::TimedWait>();
    __x = &local_60;
    std::shared_ptr<LockstepScheduler::TimedWait>::operator=
              ((shared_ptr<LockstepScheduler::TimedWait> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (shared_ptr<LockstepScheduler::TimedWait> *)in_stack_ffffffffffffff48);
    std::shared_ptr<LockstepScheduler::TimedWait>::~shared_ptr
              ((shared_ptr<LockstepScheduler::TimedWait> *)0x1164c2);
    peVar6 = std::
             __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1164d9);
    ppVar3 = local_18;
    peVar6->time_us = (uint64_t)local_28;
    peVar6 = std::
             __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1164f9);
    ppVar2 = local_20;
    peVar6->passed_cond = (pthread_cond_t *)ppVar3;
    peVar6 = std::
             __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x116518);
    peVar6->passed_lock = ppVar2;
    std::
    vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
    ::push_back(local_28,__x);
    *(undefined1 *)(in_RDI + 0x48) = 1;
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0x6e;
    local_4 = -1;
  }
  local_50 = (uint)(pvVar4 >= pvVar1);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x116551);
  if (local_50 == 0) {
    local_64 = pthread_cond_wait(local_18,(pthread_mutex_t *)local_20);
    iVar7 = local_64;
    pthread_mutex_unlock((pthread_mutex_t *)local_20);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)CONCAT44(iVar7,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    if (local_64 == 0) {
      peVar6 = std::
               __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1165bc);
      if ((peVar6->timeout & 1U) != 0) {
        piVar5 = __errno_location();
        *piVar5 = 0x6e;
        local_64 = -1;
      }
    }
    peVar6 = std::
             __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1165fe);
    peVar6->done = true;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11660c);
    pthread_mutex_lock((pthread_mutex_t *)local_20);
    local_4 = local_64;
    local_50 = 1;
  }
  std::shared_ptr<LockstepScheduler::TimedWait>::~shared_ptr
            ((shared_ptr<LockstepScheduler::TimedWait> *)0x116639);
  return local_4;
}

Assistant:

int LockstepScheduler::cond_timedwait(pthread_cond_t *cond, pthread_mutex_t *lock, uint64_t time_us)
{
    std::shared_ptr<TimedWait> new_timed_wait;
    {
        std::lock_guard<std::mutex> lock_timed_waits(timed_waits_mutex_);

        // The time has already passed.
        if (time_us <= time_us_) {
            errno = ETIMEDOUT;
            return -1;
        }

        new_timed_wait = std::make_shared<TimedWait>();
        new_timed_wait->time_us = time_us;
        new_timed_wait->passed_cond = cond;
        new_timed_wait->passed_lock = lock;
        timed_waits_.push_back(new_timed_wait);
        timed_waits_iterator_invalidated_ = true;
    }

    while (true) {
        int result = pthread_cond_wait(cond, lock);

        // We need to unlock before aqcuiring the timed_waits_mutex, otherwise
        // we are at rist of priority inversion.
        pthread_mutex_unlock(lock);

        {
            std::lock_guard<std::mutex> lock_timed_waits(timed_waits_mutex_);

            if (result == 0 && new_timed_wait->timeout) {
                errno = ETIMEDOUT;
                result = -1;
            }

            new_timed_wait->done = true;
        }

        // The lock needs to be locked on exit of this function
        pthread_mutex_lock(lock);
        return result;
    }
}